

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_Linetype * Internal_BuiltInLinePattern(ON_Linetype *__return_storage_ptr__,int index)

{
  ON_UUID id;
  ON_UUID id_00;
  ON_UUID id_01;
  ON_UUID id_02;
  ON_UUID id_03;
  ON_UUID id_04;
  ON_UUID id_05;
  ON_UUID id_06;
  ON_UUID id_07;
  int iVar1;
  double *pdVar2;
  int local_21c;
  undefined1 auStack_218 [4];
  int i;
  ON_LinetypeSegment segment;
  double local_200 [4];
  ON_UUID line_pattern_id_8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0 [4];
  ON_UUID line_pattern_id_7;
  double local_180;
  double local_178;
  double local_170 [4];
  ON_UUID line_pattern_id_6;
  double local_140;
  double local_138;
  double local_130 [4];
  ON_UUID line_pattern_id_5;
  double local_100 [4];
  ON_UUID line_pattern_id_4;
  double local_d0 [4];
  ON_UUID line_pattern_id_3;
  ON_UUID line_pattern_id_2;
  ON_UUID line_pattern_id_1;
  ON_UUID line_pattern_id;
  undefined1 local_30 [8];
  ON_SimpleArray<double> segments;
  int index_local;
  ON_Linetype *line_pattern;
  
  segments.m_count._3_1_ = 0;
  segments.m_capacity = index;
  ON_Linetype::ON_Linetype(__return_storage_ptr__);
  ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)local_30,8);
  switch(segments.m_capacity) {
  case -9:
    local_200[3] = 6.879980217602751e+58;
    line_pattern_id_8.Data1 = 0x13b10ca2;
    line_pattern_id_8.Data2 = 0x795a;
    line_pattern_id_8.Data3 = 0x819;
    local_200[1] = 6.879980217602751e+58;
    local_200[2] = 1.2054843091014648e-269;
    id.Data4[0] = 0xa2;
    id.Data4[1] = '\f';
    id.Data4[2] = 0xb1;
    id.Data4[3] = '\x13';
    id.Data4[4] = 'Z';
    id.Data4[5] = 'y';
    id.Data4[6] = '\x19';
    id.Data4[7] = '\b';
    id.Data1 = 0xe6a283a4;
    id.Data2 = 0xebbe;
    id.Data3 = 0x4c25;
    Internal_SystemModelComponentInit
              (id,segments.m_capacity,L"Dots",&__return_storage_ptr__->super_ON_ModelComponent);
    local_200[0] = 0.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,local_200);
    segment.m_seg_type = Unset;
    segment.m_reserved2 = 0xbff00000;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,(double *)&segment.m_seg_type)
    ;
    break;
  case -8:
    local_1b0[3] = 81050276.8614176;
    line_pattern_id_7.Data1 = 0x543aa583;
    line_pattern_id_7.Data2 = 0x331a;
    line_pattern_id_7.Data3 = 0x3056;
    local_1b0[1] = 81050276.8614176;
    local_1b0[2] = 7.668786579526107e-76;
    id_00.Data4[0] = 0x83;
    id_00.Data4[1] = 0xa5;
    id_00.Data4[2] = ':';
    id_00.Data4[3] = 'T';
    id_00.Data4[4] = '\x1a';
    id_00.Data4[5] = '3';
    id_00.Data4[6] = 'V';
    id_00.Data4[7] = '0';
    id_00.Data1 = 0x93721775;
    id_00.Data2 = 0x52ea;
    id_00.Data3 = 0x4193;
    Internal_SystemModelComponentInit
              (id_00,segments.m_capacity,L"Border",&__return_storage_ptr__->super_ON_ModelComponent)
    ;
    local_1b0[0] = 4.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,local_1b0);
    local_1b8 = -1.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,&local_1b8);
    local_1c0 = 4.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,&local_1c0);
    local_1c8 = -1.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,&local_1c8);
    local_1d0 = 1.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,&local_1d0);
    line_pattern_id_8.Data4[0] = '\0';
    line_pattern_id_8.Data4[1] = '\0';
    line_pattern_id_8.Data4[2] = '\0';
    line_pattern_id_8.Data4[3] = '\0';
    line_pattern_id_8.Data4[4] = '\0';
    line_pattern_id_8.Data4[5] = '\0';
    line_pattern_id_8.Data4[6] = 0xf0;
    line_pattern_id_8.Data4[7] = 0xbf;
    ON_SimpleArray<double>::Append
              ((ON_SimpleArray<double> *)local_30,(double *)line_pattern_id_8.Data4);
    break;
  case -7:
    local_170[3] = 2.854416825291672e+40;
    line_pattern_id_6.Data1 = 0x2ce5d4be;
    line_pattern_id_6.Data2 = 0x9751;
    line_pattern_id_6.Data3 = 0xc0d;
    local_170[1] = 2.854416825291672e+40;
    local_170[2] = 1.2915596592080522e-250;
    id_01.Data4[0] = 0xbe;
    id_01.Data4[1] = 0xd4;
    id_01.Data4[2] = 0xe5;
    id_01.Data4[3] = ',';
    id_01.Data4[4] = 'Q';
    id_01.Data4[5] = 0x97;
    id_01.Data4[6] = '\r';
    id_01.Data4[7] = '\f';
    id_01.Data1 = 0xb59b1b65;
    id_01.Data2 = 0xf88f;
    id_01.Data3 = 0x4854;
    Internal_SystemModelComponentInit
              (id_01,segments.m_capacity,L"Center",&__return_storage_ptr__->super_ON_ModelComponent)
    ;
    local_170[0] = 2.5;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,local_170);
    local_178 = -0.5;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,&local_178);
    local_180 = 0.5;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,&local_180);
    line_pattern_id_7.Data4[0] = '\0';
    line_pattern_id_7.Data4[1] = '\0';
    line_pattern_id_7.Data4[2] = '\0';
    line_pattern_id_7.Data4[3] = '\0';
    line_pattern_id_7.Data4[4] = '\0';
    line_pattern_id_7.Data4[5] = '\0';
    line_pattern_id_7.Data4[6] = 0xe0;
    line_pattern_id_7.Data4[7] = 0xbf;
    ON_SimpleArray<double>::Append
              ((ON_SimpleArray<double> *)local_30,(double *)line_pattern_id_7.Data4);
    break;
  case -6:
    local_130[3] = 5.569789524080541e+22;
    line_pattern_id_5.Data1 = 0x6e1320ab;
    line_pattern_id_5.Data2 = 0x74ae;
    line_pattern_id_5.Data3 = 0x4dc3;
    local_130[1] = 5.569789524080541e+22;
    local_130[2] = 4.097866944069602e+66;
    id_02.Data4[0] = 0xab;
    id_02.Data4[1] = ' ';
    id_02.Data4[2] = '\x13';
    id_02.Data4[3] = 'n';
    id_02.Data4[4] = 0xae;
    id_02.Data4[5] = 't';
    id_02.Data4[6] = 0xc3;
    id_02.Data4[7] = 'M';
    id_02.Data1 = 0x249ad50d;
    id_02.Data2 = 0x96c7;
    id_02.Data3 = 0x44a7;
    Internal_SystemModelComponentInit
              (id_02,segments.m_capacity,L"DashDot",&__return_storage_ptr__->super_ON_ModelComponent
              );
    local_130[0] = 4.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,local_130);
    local_138 = -1.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,&local_138);
    local_140 = 0.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,&local_140);
    line_pattern_id_6.Data4[0] = '\0';
    line_pattern_id_6.Data4[1] = '\0';
    line_pattern_id_6.Data4[2] = '\0';
    line_pattern_id_6.Data4[3] = '\0';
    line_pattern_id_6.Data4[4] = '\0';
    line_pattern_id_6.Data4[5] = '\0';
    line_pattern_id_6.Data4[6] = 0xf0;
    line_pattern_id_6.Data4[7] = 0xbf;
    ON_SimpleArray<double>::Append
              ((ON_SimpleArray<double> *)local_30,(double *)line_pattern_id_6.Data4);
    break;
  case -5:
    local_100[3] = 6430.923923799531;
    line_pattern_id_4.Data1 = 0x1946e185;
    line_pattern_id_4.Data2 = 0xf6c1;
    line_pattern_id_4.Data3 = 0xc570;
    local_100[1] = 6430.923923799531;
    local_100[2] = -3.281292369858766e+26;
    id_03.Data4[0] = 0x85;
    id_03.Data4[1] = 0xe1;
    id_03.Data4[2] = 'F';
    id_03.Data4[3] = '\x19';
    id_03.Data4[4] = 0xc1;
    id_03.Data4[5] = 0xf6;
    id_03.Data4[6] = 'p';
    id_03.Data4[7] = 0xc5;
    id_03.Data1 = 0x864526fb;
    id_03.Data2 = 0x1eec;
    id_03.Data3 = 0x40b9;
    Internal_SystemModelComponentInit
              (id_03,segments.m_capacity,L"Dashed",&__return_storage_ptr__->super_ON_ModelComponent)
    ;
    local_100[0] = 5.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,local_100);
    line_pattern_id_5.Data4[0] = '\0';
    line_pattern_id_5.Data4[1] = '\0';
    line_pattern_id_5.Data4[2] = '\0';
    line_pattern_id_5.Data4[3] = '\0';
    line_pattern_id_5.Data4[4] = '\0';
    line_pattern_id_5.Data4[5] = '\0';
    line_pattern_id_5.Data4[6] = '\x14';
    line_pattern_id_5.Data4[7] = 0xc0;
    ON_SimpleArray<double>::Append
              ((ON_SimpleArray<double> *)local_30,(double *)line_pattern_id_5.Data4);
    break;
  case -4:
    local_d0[3] = 1935205402503939.8;
    line_pattern_id_3.Data1 = 0x33a4fea7;
    line_pattern_id_3.Data2 = 0x4319;
    line_pattern_id_3.Data3 = 0x8a6c;
    local_d0[1] = 1935205402503939.8;
    local_d0[2] = -1.838138420551975e-258;
    id_04.Data4[0] = 0xa7;
    id_04.Data4[1] = 0xfe;
    id_04.Data4[2] = 0xa4;
    id_04.Data4[3] = '3';
    id_04.Data4[4] = '\x19';
    id_04.Data4[5] = 'C';
    id_04.Data4[6] = 'l';
    id_04.Data4[7] = 0x8a;
    id_04.Data1 = 0x7a55ac0f;
    id_04.Data2 = 0x803c;
    id_04.Data3 = 0x431b;
    Internal_SystemModelComponentInit
              (id_04,segments.m_capacity,L"Hidden",&__return_storage_ptr__->super_ON_ModelComponent)
    ;
    local_d0[0] = 2.0;
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_30,local_d0);
    line_pattern_id_4.Data4[0] = '\0';
    line_pattern_id_4.Data4[1] = '\0';
    line_pattern_id_4.Data4[2] = '\0';
    line_pattern_id_4.Data4[3] = '\0';
    line_pattern_id_4.Data4[4] = '\0';
    line_pattern_id_4.Data4[5] = '\0';
    line_pattern_id_4.Data4[6] = '\0';
    line_pattern_id_4.Data4[7] = 0xc0;
    ON_SimpleArray<double>::Append
              ((ON_SimpleArray<double> *)local_30,(double *)line_pattern_id_4.Data4);
    break;
  case -3:
    line_pattern_id_3.Data4[0] = 'q';
    line_pattern_id_3.Data4[1] = 0xd7;
    line_pattern_id_3.Data4[2] = 'Y';
    line_pattern_id_3.Data4[3] = 0xef;
    line_pattern_id_3.Data4[4] = 0x99;
    line_pattern_id_3.Data4[5] = 'P';
    line_pattern_id_3.Data4[6] = '`';
    line_pattern_id_3.Data4[7] = 'O';
    id_05.Data4[0] = 0x99;
    id_05.Data4[1] = '\x14';
    id_05.Data4[2] = 0xc1;
    id_05.Data4[3] = 0x83;
    id_05.Data4[4] = 'j';
    id_05.Data4[5] = 0xeb;
    id_05.Data4[6] = 0xe4;
    id_05.Data4[7] = 0x84;
    id_05.Data1 = 0xef59d771;
    id_05.Data2 = 0x5099;
    id_05.Data3 = 0x4f60;
    Internal_SystemModelComponentInit
              (id_05,segments.m_capacity,L"By Parent",
               &__return_storage_ptr__->super_ON_ModelComponent);
    ON_Linetype::AppendSegment(__return_storage_ptr__,&ON_LinetypeSegment::OneMillimeterLine);
    break;
  case -2:
    id_06.Data4[0] = 0x8d;
    id_06.Data4[1] = 0x86;
    id_06.Data4[2] = 0xd4;
    id_06.Data4[3] = 'I';
    id_06.Data4[4] = 0xfd;
    id_06.Data4[5] = 'X';
    id_06.Data4[6] = 'P';
    id_06.Data4[7] = 0xb8;
    id_06.Data1 = 0x913882da;
    id_06.Data2 = 0xbce9;
    id_06.Data3 = 0x4a67;
    Internal_SystemModelComponentInit
              (id_06,segments.m_capacity,L"By Layer",
               &__return_storage_ptr__->super_ON_ModelComponent);
    ON_Linetype::AppendSegment(__return_storage_ptr__,&ON_LinetypeSegment::OneMillimeterLine);
    break;
  case -1:
    id_07.Data4[0] = 0xa0;
    id_07.Data4[1] = 'Y';
    id_07.Data4[2] = '\x03';
    id_07.Data4[3] = '\"';
    id_07.Data4[4] = '$';
    id_07.Data4[5] = 0xc6;
    id_07.Data4[6] = 0xfd;
    id_07.Data4[7] = 'U';
    id_07.Data1 = 0x3999bed5;
    id_07.Data2 = 0x78ee;
    id_07.Data3 = 0x4d73;
    Internal_SystemModelComponentInit
              (id_07,segments.m_capacity,L"Continuous",
               &__return_storage_ptr__->super_ON_ModelComponent);
    ON_Linetype::AppendSegment(__return_storage_ptr__,&ON_LinetypeSegment::OneMillimeterLine);
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_statics.cpp"
               ,0x77b,"","Invalid index parameter");
  }
  iVar1 = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)local_30);
  if (0 < iVar1) {
    ON_LinetypeSegment::ON_LinetypeSegment((ON_LinetypeSegment *)auStack_218);
    for (local_21c = 0; iVar1 = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)local_30),
        local_21c < iVar1; local_21c = local_21c + 1) {
      pdVar2 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)local_30,local_21c);
      _auStack_218 = ABS(*pdVar2);
      pdVar2 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)local_30,local_21c);
      segment.m_length._0_4_ = (*pdVar2 < 0.0) + 1;
      ON_Linetype::AppendSegment(__return_storage_ptr__,(ON_LinetypeSegment *)auStack_218);
    }
  }
  ON_Linetype::LockPattern(__return_storage_ptr__);
  segments.m_count._3_1_ = 1;
  ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)local_30);
  if ((segments.m_count._3_1_ & 1) == 0) {
    ON_Linetype::~ON_Linetype(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static ON_Linetype Internal_BuiltInLinePattern( int index )
{
  ON_Linetype line_pattern;
  ON_SimpleArray<double> segments(8);

  switch (index)
  {
  case -1: // Continuous
    {
      const ON_UUID line_pattern_id =
      { 0x3999bed5, 0x78ee, 0x4d73,{ 0xa0, 0x59, 0x3, 0x22, 0x24, 0xc6, 0xfd, 0x55 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Continuous",
        line_pattern
      );
      line_pattern.AppendSegment(ON_LinetypeSegment::OneMillimeterLine);
    }
    break;

  case -2: // By Layer
    {
      const ON_UUID line_pattern_id =
      { 0x913882da, 0xbce9, 0x4a67,{ 0x8d, 0x86, 0xd4, 0x49, 0xfd, 0x58, 0x50, 0xb8 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"By Layer",
        line_pattern
        );
      line_pattern.AppendSegment(ON_LinetypeSegment::OneMillimeterLine);
    }
    break;

  case -3: // By Parent
    {
      const ON_UUID line_pattern_id =
      { 0xef59d771, 0x5099, 0x4f60,{ 0x99, 0x14, 0xc1, 0x83, 0x6a, 0xeb, 0xe4, 0x84 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"By Parent",
        line_pattern
        );
      line_pattern.AppendSegment(ON_LinetypeSegment::OneMillimeterLine);
    }
    break;

  case -4: // Hidden
    {
      // {7A55AC0F-803C-431B-A7FE-A43319436C8A}
      const ON_UUID line_pattern_id = 
      { 0x7a55ac0f, 0x803c, 0x431b, { 0xa7, 0xfe, 0xa4, 0x33, 0x19, 0x43, 0x6c, 0x8a } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Hidden",
        line_pattern
        );
      segments.Append(2.0);
      segments.Append(-2.0);
    }
    break;

  case -5: // Dashed
    {
      // {864526FB-1EEC-40B9-85E1-4619C1F670C5}
      const ON_UUID line_pattern_id =
      { 0x864526fb, 0x1eec, 0x40b9, { 0x85, 0xe1, 0x46, 0x19, 0xc1, 0xf6, 0x70, 0xc5 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Dashed",
        line_pattern
        );
      segments.Append(5.0);
      segments.Append(-5.0);
    }
    break;

  case -6: // DashDot
    {
      // {249AD50D-96C7-44A7-AB20-136EAE74C34D}
      const ON_UUID line_pattern_id =
      { 0x249ad50d, 0x96c7, 0x44a7, { 0xab, 0x20, 0x13, 0x6e, 0xae, 0x74, 0xc3, 0x4d } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"DashDot",
        line_pattern
        );
      segments.Append(4.0);
      segments.Append(-1.0);
      segments.Append(0.0);
      segments.Append(-1.0);
    }
    break;

  case -7: // Center
    {
      // {B59B1B65-F88F-4854-BED4-E52C51970D0C}
      const ON_UUID line_pattern_id =
      { 0xb59b1b65, 0xf88f, 0x4854, { 0xbe, 0xd4, 0xe5, 0x2c, 0x51, 0x97, 0xd, 0xc } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Center",
        line_pattern
        );
      segments.Append(2.5);
      segments.Append(-0.5);
      segments.Append(0.5);
      segments.Append(-0.5);
    }
    break;

  case -8: // Border
    {
      // {93721775-52EA-4193-83A5-3A541A335630}
      const ON_UUID line_pattern_id =
      { 0x93721775, 0x52ea, 0x4193, { 0x83, 0xa5, 0x3a, 0x54, 0x1a, 0x33, 0x56, 0x30 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Border",
        line_pattern
        );
      segments.Append(4.0);
      segments.Append(-1.0);
      segments.Append(4.0);
      segments.Append(-1.0);
      segments.Append(1.0);
      segments.Append(-1.0);
    }
    break;

  case -9: // Dots
    {
      // {E6A283A4-EBBE-4C25-A20C-B1135A791908}
      const ON_UUID line_pattern_id =
      { 0xe6a283a4, 0xebbe, 0x4c25, { 0xa2, 0xc, 0xb1, 0x13, 0x5a, 0x79, 0x19, 0x8 } };
      Internal_SystemModelComponentInit(
        line_pattern_id,
        index,
        L"Dots",
        line_pattern
        );
      segments.Append(0.0);
      segments.Append(-1.0);
    }
    break;

  default:
    ON_ERROR("Invalid index parameter");
    break;
  }

  if (segments.Count() > 0)
  {
    ON_LinetypeSegment segment;
    for( int i = 0; i < segments.Count(); i++)
    {
      segment.m_length = fabs(segments[i]);
      segment.m_seg_type = (segments[i] >=  0.0)
                         ? ON_LinetypeSegment::eSegType::stLine
                         : ON_LinetypeSegment::eSegType::stSpace;    
      line_pattern.AppendSegment(segment);
    }
  }
  line_pattern.LockPattern();

  return line_pattern;
}